

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_tests.cpp
# Opt level: O1

void move_value_test(void)

{
  FILE *output;
  FILE *input;
  int iVar1;
  uchar *data;
  char *pcVar2;
  char *__s;
  char *__s_00;
  char *__s_01;
  char *__s_02;
  
  putchar(10);
  printf("move_value_test");
  putchar(10);
  data = (uchar *)operator_new__(10000);
  memset(data,0,10000);
  *data = 'd';
  data[2] = 'L';
  iVar1 = libbrain::
          state<4U,_(libbrain::bfop)1,_(libbrain::bfop)6,_(libbrain::bfop)2,_(libbrain::bfop)2,_(libbrain::bfop)7,_(libbrain::bfop)1,_(libbrain::bfop)8,_(libbrain::bfop)3,_(libbrain::bfop)3,_(libbrain::bfop)7,_(libbrain::bfop)1,_(libbrain::bfop)2,_(libbrain::bfop)2,_(libbrain::bfop)0,_(libbrain::bfop)3,_(libbrain::bfop)3,_(libbrain::bfop)8,_(libbrain::bfop)9>
          ::exec(data,2,_stdout,_stdin);
  __s_01 = "=> Failed: status_code == 0";
  pcVar2 = "=> Failed: status_code == 0";
  if (iVar1 == 0) {
    pcVar2 = "=> Passed: status_code == 0";
  }
  puts(pcVar2);
  __s_02 = "=> Failed: data[0] == 0";
  pcVar2 = "=> Failed: data[0] == 0";
  if (*data == '\0') {
    pcVar2 = "=> Passed: data[0] == 0";
  }
  puts(pcVar2);
  __s = "=> Failed: data[1] == 0";
  pcVar2 = "=> Failed: data[1] == 0";
  if (data[1] == '\0') {
    pcVar2 = "=> Passed: data[1] == 0";
  }
  puts(pcVar2);
  __s_00 = "=> Failed: data[2] == 100";
  pcVar2 = "=> Failed: data[2] == 100";
  if (data[2] == 'd') {
    pcVar2 = "=> Passed: data[2] == 100";
  }
  puts(pcVar2);
  data[1] = 0xc9;
  input = _stdin;
  output = _stdout;
  if (data[3] == '\0') {
    data[1] = 200;
    data[3] = '\x01';
    iVar1 = libbrain::
            state<15U,_(libbrain::bfop)8,_(libbrain::bfop)6,_(libbrain::bfop)2,_(libbrain::bfop)2,_(libbrain::bfop)7,_(libbrain::bfop)1,_(libbrain::bfop)8,_(libbrain::bfop)3,_(libbrain::bfop)3,_(libbrain::bfop)7,_(libbrain::bfop)1,_(libbrain::bfop)2,_(libbrain::bfop)2,_(libbrain::bfop)0,_(libbrain::bfop)3,_(libbrain::bfop)3,_(libbrain::bfop)8,_(libbrain::bfop)9>
            ::exec(data,1,output,input);
  }
  else {
    iVar1 = libbrain::
            state<4U,_(libbrain::bfop)1,_(libbrain::bfop)6,_(libbrain::bfop)2,_(libbrain::bfop)2,_(libbrain::bfop)7,_(libbrain::bfop)1,_(libbrain::bfop)8,_(libbrain::bfop)3,_(libbrain::bfop)3,_(libbrain::bfop)7,_(libbrain::bfop)1,_(libbrain::bfop)2,_(libbrain::bfop)2,_(libbrain::bfop)0,_(libbrain::bfop)3,_(libbrain::bfop)3,_(libbrain::bfop)8,_(libbrain::bfop)9>
            ::exec(data,3,_stdout,_stdin);
  }
  if (iVar1 == 0) {
    __s_01 = "=> Passed: status_code == 0";
  }
  puts(__s_01);
  if (*data == '\0') {
    __s_02 = "=> Passed: data[0] == 0";
  }
  puts(__s_02);
  if (data[1] == '\0') {
    __s = "=> Passed: data[1] == 0";
  }
  puts(__s);
  if (data[2] == 'd') {
    __s_00 = "=> Passed: data[2] == 100";
  }
  puts(__s_00);
  pcVar2 = "=> Failed: data[3] == 201";
  if (data[3] == 0xc9) {
    pcVar2 = "=> Passed: data[3] == 201";
  }
  puts(pcVar2);
  operator_delete__(data);
  return;
}

Assistant:

void move_value_test() {
    LIBBRAIN_TEST

    auto* data = BRAIN_ALLOC_TAPE(10000);
    data[0] = 100;
    data[2] = 76;

    // BF Program which moves the value in one index to one 2 indicies over, overwriting the thing 2 cells over
    BRAIN_PROGRAM move_program = BRAIN_COMPILE(>>[-]<<[->>+<<]);
    int status_code = move_program.exec(data, 0);

    LIBBRAIN_ASSERT(status_code, 0)
    LIBBRAIN_ASSERT(data[0], 0)
    LIBBRAIN_ASSERT(data[1], 0)
    LIBBRAIN_ASSERT(data[2], 100)

    data[1] = 201;

    status_code = move_program.exec(data, 1);
    LIBBRAIN_ASSERT(status_code, 0)
    LIBBRAIN_ASSERT(data[0], 0)
    LIBBRAIN_ASSERT(data[1], 0)
    LIBBRAIN_ASSERT(data[2], 100)
    LIBBRAIN_ASSERT(data[3], 201)

    delete[] data;
}